

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_42055d::BracedExpr::printLeft(BracedExpr *this,OutputStream *S)

{
  bool bVar1;
  size_t sVar2;
  Node *pNVar3;
  char *pcVar4;
  
  bVar1 = this->IsArray;
  OutputStream::grow(S,1);
  sVar2 = S->CurrentPosition;
  S->CurrentPosition = sVar2 + 1;
  if (bVar1 == true) {
    S->Buffer[sVar2] = '[';
    pNVar3 = this->Elem;
    (*pNVar3->_vptr_Node[4])(pNVar3,S);
    if (pNVar3->RHSComponentCache != No) {
      (*pNVar3->_vptr_Node[5])(pNVar3,S);
    }
    OutputStream::grow(S,1);
    sVar2 = S->CurrentPosition;
    S->CurrentPosition = sVar2 + 1;
    S->Buffer[sVar2] = ']';
  }
  else {
    S->Buffer[sVar2] = '.';
    pNVar3 = this->Elem;
    (*pNVar3->_vptr_Node[4])(pNVar3,S);
    if (pNVar3->RHSComponentCache != No) {
      (*pNVar3->_vptr_Node[5])(pNVar3,S);
    }
  }
  if ((this->Init->K & ~KDotSuffix) != KBracedExpr) {
    OutputStream::grow(S,3);
    pcVar4 = S->Buffer;
    sVar2 = S->CurrentPosition;
    pcVar4[sVar2 + 2] = ' ';
    pcVar4 = pcVar4 + sVar2;
    pcVar4[0] = ' ';
    pcVar4[1] = '=';
    S->CurrentPosition = S->CurrentPosition + 3;
  }
  pNVar3 = this->Init;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache == No) {
    return;
  }
  (*pNVar3->_vptr_Node[5])(pNVar3,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsArray) {
      S += '[';
      Elem->print(S);
      S += ']';
    } else {
      S += '.';
      Elem->print(S);
    }
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }